

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O0

void deqp::gles3::Functional::evalTexture2DProjGrad3Offset(ShaderEvalContext *c,TexLookupParams *p)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float *pfVar5;
  float lod;
  undefined1 local_50 [8];
  undefined1 local_48 [16];
  Vector<float,_4> local_38;
  tcu local_28 [8];
  float local_20 [2];
  TexLookupParams *local_18;
  TexLookupParams *p_local;
  ShaderEvalContext *c_local;
  
  local_18 = p;
  p_local = (TexLookupParams *)c;
  pfVar5 = tcu::Vector<float,_4>::x(c->in);
  fVar1 = *pfVar5;
  pfVar5 = tcu::Vector<float,_4>::z((Vector<float,_4> *)(p_local + 1));
  fVar2 = *pfVar5;
  pfVar5 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(p_local + 1));
  fVar3 = *pfVar5;
  pfVar5 = tcu::Vector<float,_4>::z((Vector<float,_4> *)(p_local + 1));
  fVar4 = *pfVar5;
  lod = computeLodFromGrad2D((ShaderEvalContext *)p_local);
  tcu::Vector<int,_3>::swizzle((Vector<int,_3> *)local_50,(int)local_18 + 4,0);
  texture2DOffset((ShaderEvalContext *)local_48,fVar1 / fVar2,fVar3 / fVar4,lod,(IVec2 *)c);
  tcu::operator*((tcu *)&local_38,(Vector<float,_4> *)local_48,&local_18->scale);
  tcu::operator+(local_28,&local_38,&local_18->bias);
  *(tcu (*) [8])p_local[10].scale.m_data = local_28;
  *(float (*) [2])(p_local[10].scale.m_data + 2) = local_20;
  return;
}

Assistant:

static void		evalTexture2DProjGrad3Offset	(gls::ShaderEvalContext& c, const TexLookupParams& p)	{ c.color = texture2DOffset(c, c.in[0].x()/c.in[0].z(), c.in[0].y()/c.in[0].z(), computeLodFromGrad2D(c), p.offset.swizzle(0,1))*p.scale + p.bias; }